

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,string *str_raw)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  pointer pqVar4;
  int i;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uchar uVar8;
  ulong uVar9;
  long lVar10;
  allocator local_91;
  string digits;
  string bv_size;
  string hex_to_binary;
  
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&bv_size,"",(allocator *)&digits);
  uVar9 = 0;
  while( true ) {
    pcVar3 = (str_raw->_M_dataplus)._M_p;
    iVar7 = (int)pcVar3[uVar9];
    if (iVar7 == 0x27) break;
    if (9 < iVar7 - 0x30U) {
      __assert_fail("isdigit(str_raw[ind])",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x12d,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)"
                   );
    }
    std::__cxx11::string::push_back((char)&bv_size);
    uVar9 = uVar9 + 1;
  }
  bVar1 = pcVar3[(uVar9 & 0xffffffff) + 1];
  uVar5 = bVar1 - 0x62;
  if ((6 < uVar5) || ((0x45U >> (uVar5 & 0x1f) & 1) == 0)) {
    __assert_fail("(format == \'b\') || (format == \'h\') || (format == \'d\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x13a,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  std::__cxx11::string::string((string *)&digits,"",(allocator *)&hex_to_binary);
  for (lVar10 = uVar9 + 2; (int)lVar10 < (int)str_raw->_M_string_length; lVar10 = lVar10 + 1) {
    std::__cxx11::string::push_back((char)&digits);
  }
  iVar7 = std::__cxx11::stoi(&bv_size,(size_t *)0x0,10);
  this->N = iVar7;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize(&this->bits,(long)iVar7);
  for (lVar10 = 0;
      pqVar4 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar10 < *(int *)&(this->bits).
                        super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (int)pqVar4; lVar10 = lVar10 + 1
      ) {
    pqVar4[lVar10].value = '\0';
  }
  if (bVar1 != 0x68) {
    __assert_fail("format == \'h\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x14e,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  uVar9 = 0;
  uVar5 = (uint)digits._M_string_length;
LAB_00180894:
  uVar5 = uVar5 - 1;
  if ((int)uVar5 < 0) {
    std::__cxx11::string::~string((string *)&digits);
    std::__cxx11::string::~string((string *)&bv_size);
    return;
  }
  cVar2 = digits._M_dataplus._M_p[uVar5 & 0x7fffffff];
  switch(cVar2) {
  case '0':
    std::__cxx11::string::string((string *)&hex_to_binary,"0000",&local_91);
    break;
  case '1':
    std::__cxx11::string::string((string *)&hex_to_binary,"0001",&local_91);
    break;
  case '2':
    std::__cxx11::string::string((string *)&hex_to_binary,"0010",&local_91);
    break;
  case '3':
    std::__cxx11::string::string((string *)&hex_to_binary,"0011",&local_91);
    break;
  case '4':
    std::__cxx11::string::string((string *)&hex_to_binary,"0100",&local_91);
    break;
  case '5':
    std::__cxx11::string::string((string *)&hex_to_binary,"0101",&local_91);
    break;
  case '6':
    std::__cxx11::string::string((string *)&hex_to_binary,"0110",&local_91);
    break;
  case '7':
    std::__cxx11::string::string((string *)&hex_to_binary,"0111",&local_91);
    break;
  case '8':
    std::__cxx11::string::string((string *)&hex_to_binary,"1000",&local_91);
    break;
  case '9':
    std::__cxx11::string::string((string *)&hex_to_binary,"1001",&local_91);
    break;
  default:
    switch(cVar2) {
    case 'a':
      std::__cxx11::string::string((string *)&hex_to_binary,"1010",&local_91);
      break;
    case 'b':
      std::__cxx11::string::string((string *)&hex_to_binary,"1011",&local_91);
      break;
    case 'c':
      std::__cxx11::string::string((string *)&hex_to_binary,"1100",&local_91);
      break;
    case 'd':
      std::__cxx11::string::string((string *)&hex_to_binary,"1101",&local_91);
      break;
    case 'e':
      std::__cxx11::string::string((string *)&hex_to_binary,"1110",&local_91);
      break;
    case 'f':
      std::__cxx11::string::string((string *)&hex_to_binary,"1111",&local_91);
      break;
    default:
      if (cVar2 == 'x') {
        std::__cxx11::string::string((string *)&hex_to_binary,"xxxx",&local_91);
      }
      else {
        if (cVar2 != 'z') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x41,"std::string bsim::hex_digit_to_binary(const char)");
        }
        std::__cxx11::string::string((string *)&hex_to_binary,"zzzz",&local_91);
      }
    }
  }
  if (hex_to_binary._M_string_length != 4) {
    __assert_fail("hex_to_binary.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x155,"bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
  }
  uVar6 = 0;
  lVar10 = 4;
  do {
    do {
      if (lVar10 < 1) {
        uVar9 = (ulong)((int)uVar9 + 4);
        std::__cxx11::string::~string((string *)&hex_to_binary);
        goto LAB_00180894;
      }
      lVar10 = lVar10 + -1;
    } while (this->N <= (int)(uVar6 + uVar9));
    cVar2 = hex_to_binary._M_dataplus._M_p[lVar10];
    if (cVar2 == 'z') {
      uVar8 = '\x03';
    }
    else if (cVar2 == '1') {
      uVar8 = '\x01';
    }
    else if (cVar2 == 'x') {
      uVar8 = '\x02';
    }
    else {
      if (cVar2 != '0') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x165,
                      "bsim::quad_value_bit_vector::quad_value_bit_vector(const std::string &)");
      }
      uVar8 = '\0';
    }
    (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6 + uVar9].value = uVar8;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

quad_value_bit_vector(const std::string& str_raw) : N(0) {
      std::string bv_size = "";
      int ind = 0;
      while (str_raw[ind] != '\'') {
        assert(isdigit(str_raw[ind]));
        bv_size += str_raw[ind];
        ind++;
      }

      assert (str_raw[ind] == '\'');

      ind++;

      char format = str_raw[ind];

      assert((format == 'b') ||
             (format == 'h') ||
             (format == 'd'));

      ind++;

      std::string digits = "";
      while (ind < ((int) str_raw.size())) {
        digits += str_raw[ind];
        ind++;
      }

      int num_bits = stoi(bv_size);
      N = num_bits;
      //bits.resize(NUM_BYTES(num_bits));
      bits.resize(num_bits);
      for (int i = 0; i < ((int) bits.size()); i++) {
        bits[i] = 0;
      }

      // TODO: Check that digits are not too long

      assert(format == 'h');

      int bit_ind = 0;
      for (int i = digits.size() - 1; i >= 0; i--) {
        char hex_digit = digits[i];
        std::string hex_to_binary = hex_digit_to_binary(hex_digit);

        assert(hex_to_binary.size() == 4);

        int k = 0;
        for (int j = hex_to_binary.size() - 1; j >= 0; j--) {
          // Dont add past the end
          if ((bit_ind + k) < bitLength()) {
            //std::cout << "setting digit = " << hex_to_binary[j] << std::endl;
            if (hex_to_binary[j] == '1') {
              set(bit_ind + k, quad_value(1));
            } else if (hex_to_binary[j] == '0') {
              set(bit_ind + k, quad_value(0));
            } else if (hex_to_binary[j] == 'x') {
              set(bit_ind + k, quad_value(QBV_UNKNOWN_VALUE));
            } else if (hex_to_binary[j] == 'z') {
              set(bit_ind + k, quad_value(QBV_HIGH_IMPEDANCE_VALUE));
            } else {
              assert(false);
            }
            k++;
          } else {
            //assert(hex_to_binary[j] == '0');
          }
        }
        bit_ind += 4;
      }

    }